

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O1

QStringList * QMilankovicCalendar::nameList(void)

{
  QString *data;
  QString *pQVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (QString *)QArrayData::allocate(&local_20,0x18,0x10,1,KeepSize);
  (in_RDI->d).d = (Data *)local_20;
  (in_RDI->d).ptr = pQVar1;
  (in_RDI->d).size = 0;
  (pQVar1->d).d = (Data *)0x0;
  (pQVar1->d).ptr = L"Milankovic";
  (pQVar1->d).size = 10;
  (in_RDI->d).size = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMilankovicCalendar::nameList()
{
    return { QStringLiteral("Milankovic") };
}